

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lm_trie.c
# Opt level: O1

bitarr_address_t longest_find(longest_t *longest,uint32 word,node_range_t *range)

{
  uint8 uVar1;
  undefined8 in_RAX;
  uint8 *puVar2;
  ulong uVar3;
  bitarr_address_t bVar4;
  uint32 *in_stack_ffffffffffffffe0;
  uint32 at_pointer;
  
  at_pointer = (uint32)((ulong)in_RAX >> 0x20);
  uVar1 = uniform_find((longest->base).base,(longest->base).total_bits,(longest->base).word_bits,
                       (longest->base).word_mask,range->begin - 1,range->end,
                       (longest->base).max_vocab,word,(uint32)&at_pointer,in_stack_ffffffffffffffe0)
  ;
  if (uVar1 == '\0') {
    puVar2 = (uint8 *)0x0;
    uVar3 = 0;
  }
  else {
    puVar2 = (longest->base).base;
    uVar3 = (ulong)((uint)(longest->base).word_bits + (longest->base).total_bits * at_pointer);
  }
  bVar4._8_8_ = uVar3;
  bVar4.base = puVar2;
  return bVar4;
}

Assistant:

static bitarr_address_t
longest_find(longest_t * longest, uint32 word, node_range_t * range)
{
    uint32 at_pointer;
    bitarr_address_t address;

    /* finding BitPacked with uniform find */
    if (!uniform_find
        ((void *) longest->base.base, longest->base.total_bits,
         longest->base.word_bits, longest->base.word_mask,
         range->begin - 1, 0, range->end, longest->base.max_vocab, word,
         &at_pointer)) {
        address.base = NULL;
        address.offset = 0;
        return address;
    }
    address.base = longest->base.base;
    address.offset =
        at_pointer * longest->base.total_bits + longest->base.word_bits;
    return address;
}